

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O0

QString * __thiscall QInputDialogPrivate::listViewText(QInputDialogPrivate *this)

{
  ulong uVar1;
  qsizetype in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  int row;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  QString *pQVar2;
  int index;
  QComboBox *in_stack_ffffffffffffffc8;
  QModelIndex local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = in_RDI;
  QAbstractItemView::selectionModel
            ((QAbstractItemView *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  index = (int)((ulong)pQVar2 >> 0x20);
  uVar1 = QItemSelectionModel::hasSelection();
  if ((uVar1 & 1) == 0) {
    QString::QString((QString *)0x79bdea);
  }
  else {
    QAbstractItemView::selectionModel
              ((QAbstractItemView *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    QItemSelectionModel::selectedRows((int)&stack0xffffffffffffffc8);
    QList<QModelIndex>::value
              ((QList<QModelIndex> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_RSI);
    QModelIndex::row(&local_20);
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0x79bdbc);
    QComboBox::itemText(in_stack_ffffffffffffffc8,index);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QInputDialogPrivate::listViewText() const
{
    if (listView->selectionModel()->hasSelection()) {
        int row = listView->selectionModel()->selectedRows().value(0).row();
        return comboBox->itemText(row);
    } else {
        return QString();
    }
}